

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O1

c_v128 c_v128_shuffle_8(c_v128 a,c_v128 pattern)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  c_v128 cVar4;
  c_v128 a_local;
  
  a_local.u64[0] = a.u64[0];
  a_local.u64[1] = a.u64[1];
  uVar3 = pattern.u32[0];
  auVar1 = vpinsrb_avx(ZEXT116(a_local.u8[uVar3 & 0xf]),(uint)a_local.u8[uVar3 >> 8 & 0xf],1);
  uVar2 = pattern.u32[2];
  auVar1 = vpinsrb_avx(auVar1,(uint)a_local.u8[uVar3 >> 0x10 & 0xf],2);
  auVar1 = vpinsrb_avx(auVar1,(uint)a_local.u8[uVar3 >> 0x18 & 0xf],3);
  auVar1 = vpinsrb_avx(auVar1,(uint)a_local.u8[pattern.u32[1] & 0xf],4);
  auVar1 = vpinsrb_avx(auVar1,(uint)a_local.u8[pattern.u32[1] >> 8 & 0xf],5);
  auVar1 = vpinsrb_avx(auVar1,(uint)a_local.u8[pattern.u16[3] & 0xf],6);
  auVar1 = vpinsrb_avx(auVar1,(uint)a_local.u8[pattern.u8[7] & 0xf],7);
  auVar1 = vpinsrb_avx(auVar1,(uint)a_local.u8[uVar2 & 0xf],8);
  auVar1 = vpinsrb_avx(auVar1,(uint)a_local.u8[uVar2 >> 8 & 0xf],9);
  auVar1 = vpinsrb_avx(auVar1,(uint)a_local.u8[uVar2 >> 0x10 & 0xf],10);
  auVar1 = vpinsrb_avx(auVar1,(uint)a_local.u8[uVar2 >> 0x18 & 0xf],0xb);
  auVar1 = vpinsrb_avx(auVar1,(uint)a_local.u8[pattern.u32[3] & 0xf],0xc);
  auVar1 = vpinsrb_avx(auVar1,(uint)a_local.u8[pattern.u32[3] >> 8 & 0xf],0xd);
  auVar1 = vpinsrb_avx(auVar1,(uint)a_local.u8[pattern.u16[7] & 0xf],0xe);
  auVar1 = vpinsrb_avx(auVar1,(uint)a_local.u8[pattern.u8[0xf] & 0xf],0xf);
  cVar4._8_8_ = vpextrq_avx(auVar1,1);
  cVar4.u64[0] = auVar1._0_8_;
  return cVar4;
}

Assistant:

SIMD_INLINE c_v128 c_v128_shuffle_8(c_v128 a, c_v128 pattern) {
  c_v128 t;
  int c;
  for (c = 0; c < 16; c++)
    t.u8[c] = a.u8[CONFIG_BIG_ENDIAN ? 15 - (pattern.u8[c] & 15)
                                     : pattern.u8[c] & 15];

  return t;
}